

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::broadcast(CoreBroker *this,ActionMessage *cmd)

{
  pointer pBVar1;
  BasicBrokerInfo *broker;
  pointer pBVar2;
  
  pBVar1 = (this->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pBVar2 = (this->mBrokers).dataStorage.
                super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; pBVar2 != pBVar1; pBVar2 = pBVar2 + 1) {
    if ((pBVar2->_nonLocal == false) && (pBVar2->state < DISCONNECTED)) {
      (cmd->dest_id).gid = (pBVar2->global_id).gid;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)(pBVar2->route).rid,cmd);
    }
  }
  return;
}

Assistant:

void CoreBroker::sendErrorToImmediateBrokers(int errorCode)
{
    ActionMessage errorCom(CMD_ERROR);
    errorCom.messageID = errorCode;
    broadcast(errorCom);
}